

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1553.c
# Opt level: O1

int xferinfo(void *p,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,curl_off_t ulnow)

{
  curl_mfprintf(_stderr,"xferinfo fail!\n");
  return 1;
}

Assistant:

static int xferinfo(void *p,
                    curl_off_t dltotal, curl_off_t dlnow,
                    curl_off_t ultotal, curl_off_t ulnow)
{
  (void)p;
  (void)dlnow;
  (void)dltotal;
  (void)ulnow;
  (void)ultotal;
  fprintf(stderr, "xferinfo fail!\n");
  return 1; /* fail as fast as we can */
}